

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall Nova::Driver<float,_1>::Write_First_Frame(Driver<float,_1> *this,int frame)

{
  __cxx11 local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [36];
  int local_14;
  Driver<float,_1> *pDStack_10;
  int frame_local;
  Driver<float,_1> *this_local;
  
  if (frame == this->example->first_frame) {
    local_14 = frame;
    pDStack_10 = this;
    File_Utilities::Create_Directory(&this->example->output_directory);
    std::operator+(local_38,(char *)&this->example->output_directory);
    File_Utilities::Create_Directory(local_38);
    std::__cxx11::string::~string((string *)local_38);
    std::operator+(local_68,(char *)&this->example->output_directory);
    std::__cxx11::to_string(local_88,local_14);
    File_Utilities::Write_To_Text_File<std::__cxx11::string>
              (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_68);
  }
  return;
}

Assistant:

void Driver<T,d>::
Write_First_Frame(const int frame) const
{
    if(frame==example.first_frame)
    {
        File_Utilities::Create_Directory(example.output_directory);
        File_Utilities::Create_Directory(example.output_directory+"/common");
        File_Utilities::Write_To_Text_File(example.output_directory+"/common/first_frame",std::to_string(frame));
    }
}